

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_enc.c
# Opt level: O3

int VP8EncWrite(VP8Encoder *enc)

{
  VP8EncProba *probas;
  int *percent_store;
  undefined2 uVar1;
  WebPPicture *pic_00;
  size_t sVar2;
  WebPAuxStats *pWVar3;
  WebPPicture *pWVar4;
  ulong uVar5;
  size_t sVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  size_t *psVar10;
  long lVar11;
  uint32_t uVar12;
  ulong uVar13;
  WebPEncodingError WVar14;
  WebPPicture *pWVar15;
  VP8BitWriter *bw;
  VP8BitWriter *pVVar16;
  WebPPicture *pic;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  uint8_t pad_byte [1];
  size_t size0;
  uint8_t pad_byte_1 [1];
  uint8_t local_71;
  size_t local_70;
  byte local_68 [8];
  undefined2 uStack_60;
  undefined2 uStack_5e;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  undefined1 local_58;
  undefined1 local_57;
  uint8_t *local_48;
  int local_40;
  int local_3c;
  WebPPicture *local_38;
  
  pic_00 = enc->pic;
  pVVar16 = &enc->bw;
  local_3c = (int)(0x13 / (long)enc->num_parts);
  local_40 = enc->percent;
  uVar9 = (enc->bw).run;
  sVar2 = (enc->bw).pos;
  iVar8 = enc->mb_w * enc->mb_h * 7;
  iVar7 = iVar8 + 7;
  if (-1 < iVar8) {
    iVar7 = iVar8;
  }
  iVar8 = (enc->bw).nb_bits;
  iVar7 = VP8BitWriterInit(pVVar16,(long)(iVar7 >> 3));
  if (iVar7 == 0) {
    pWVar15 = enc->pic;
LAB_00169a25:
    iVar8 = WebPEncodingSetError(pWVar15,VP8_ENC_ERROR_OUT_OF_MEMORY);
    if (iVar8 == 0) {
      return 0;
    }
  }
  else {
    local_70 = uVar9 + sVar2;
    VP8PutBitUniform(pVVar16,0);
    VP8PutBitUniform(pVVar16,0);
    probas = &enc->proba;
    iVar7 = VP8PutBitUniform(pVVar16,(uint)(1 < (enc->segment_hdr).num_segments));
    if (iVar7 != 0) {
      VP8PutBitUniform(pVVar16,(enc->segment_hdr).update_map);
      iVar7 = VP8PutBitUniform(pVVar16,1);
      if (iVar7 != 0) {
        VP8PutBitUniform(pVVar16,1);
        lVar11 = 0;
        do {
          VP8PutSignedBits(pVVar16,*(int *)((long)&enc->dqm[0].quant + lVar11),7);
          lVar11 = lVar11 + 0x2e8;
        } while (lVar11 != 0xba0);
        lVar11 = 0;
        do {
          VP8PutSignedBits(pVVar16,*(int *)((long)&enc->dqm[0].fstrength + lVar11),6);
          lVar11 = lVar11 + 0x2e8;
        } while (lVar11 != 0xba0);
      }
      if ((enc->segment_hdr).update_map != 0) {
        lVar11 = 0;
        do {
          iVar7 = VP8PutBitUniform(pVVar16,(uint)(probas->segments[lVar11] != 0xff));
          if (iVar7 != 0) {
            VP8PutBits(pVVar16,(uint)probas->segments[lVar11],8);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
      }
    }
    iVar7 = (enc->filter_hdr).i4x4_lf_delta;
    local_48 = (uint8_t *)(long)iVar8;
    VP8PutBitUniform(pVVar16,(enc->filter_hdr).simple);
    VP8PutBits(pVVar16,(enc->filter_hdr).level,6);
    uVar12 = 3;
    VP8PutBits(pVVar16,(enc->filter_hdr).sharpness,3);
    iVar8 = VP8PutBitUniform(pVVar16,(uint)(iVar7 != 0));
    if ((iVar8 != 0) &&
       (iVar8 = VP8PutBitUniform(pVVar16,(uint)((enc->filter_hdr).i4x4_lf_delta != 0)), iVar8 != 0))
    {
      VP8PutBits(pVVar16,0,4);
      VP8PutSignedBits(pVVar16,(enc->filter_hdr).i4x4_lf_delta,6);
      VP8PutBits(pVVar16,0,3);
    }
    iVar8 = enc->num_parts;
    if (iVar8 == 4) {
      uVar12 = 2;
    }
    else if (iVar8 != 8) {
      uVar12 = (uint32_t)(iVar8 == 2);
    }
    VP8PutBits(pVVar16,uVar12,2);
    VP8PutBits(pVVar16,enc->base_quant,7);
    VP8PutSignedBits(pVVar16,enc->dq_y1_dc,4);
    VP8PutSignedBits(pVVar16,enc->dq_y2_dc,4);
    VP8PutSignedBits(pVVar16,enc->dq_y2_ac,4);
    VP8PutSignedBits(pVVar16,enc->dq_uv_dc,4);
    VP8PutSignedBits(pVVar16,enc->dq_uv_ac,4);
    VP8PutBitUniform(pVVar16,0);
    VP8WriteProbas(pVVar16,probas);
    lVar11 = (long)(enc->bw).nb_bits;
    sVar2 = (enc->bw).pos;
    uVar9 = (enc->bw).run;
    VP8CodeIntraModes(enc);
    VP8BitWriterFinish(pVVar16);
    pWVar15 = enc->pic;
    pWVar3 = pWVar15->stats;
    if (pWVar3 != (WebPAuxStats *)0x0) {
      sVar6 = (enc->bw).pos;
      iVar8 = (enc->bw).run;
      iVar7 = (enc->bw).nb_bits;
      lVar17 = sVar2 + uVar9;
      pWVar3->header_bytes[0] =
           (int)(lVar11 + lVar17 * 8 + ~((long)local_48 + local_70 * 8) + 8 >> 3);
      pWVar3->header_bytes[1] =
           (int)(((long)iVar7 - (lVar11 + lVar17 * 8 + 8)) + 0xfU >> 3) + (int)sVar6 + iVar8;
      pWVar3->alpha_data_size = enc->alpha_data_size;
    }
    if ((enc->bw).error != 0) goto LAB_00169a25;
  }
  sVar2 = (enc->bw).pos;
  iVar8 = enc->num_parts;
  lVar11 = sVar2 + (long)(iVar8 * 3 + -3) + 10;
  if (0 < (long)iVar8) {
    lVar17 = 0;
    do {
      lVar11 = lVar11 + *(long *)((long)&enc->parts[0].pos + lVar17);
      lVar17 = lVar17 + 0x30;
    } while ((long)iVar8 * 0x30 != lVar17);
  }
  uVar13 = (ulong)((uint)lVar11 & 1);
  bVar19 = enc->has_alpha == 0;
  lVar17 = uVar13 + 0x1e;
  if (bVar19) {
    lVar17 = uVar13 + 0xc;
  }
  uVar18 = lVar17 + lVar11;
  if (!bVar19) {
    uVar18 = uVar18 + (enc->alpha_data_size + (enc->alpha_data_size & 1) + 8);
  }
  if (0xfffffffe < uVar18) {
    iVar8 = WebPEncodingSetError(pic_00,VP8_ENC_ERROR_FILE_TOO_BIG);
    return iVar8;
  }
  pWVar15 = enc->pic;
  local_48 = (enc->bw).buf;
  local_68[0] = 0x52;
  local_68[1] = 0x49;
  local_68[2] = 0x46;
  local_68[3] = 0x46;
  uStack_60 = 0x4557;
  uStack_5e = 0x5042;
  local_68[4] = (byte)uVar18;
  local_68[5] = (byte)(uVar18 >> 8);
  local_68[6] = (byte)(uVar18 >> 0x10);
  local_68[7] = (byte)(uVar18 >> 0x18);
  local_70 = sVar2;
  iVar8 = (*pWVar15->writer)(local_68,0xc,pWVar15);
  WVar14 = VP8_ENC_ERROR_BAD_WRITE;
  if (iVar8 == 0) {
LAB_00169c88:
    iVar8 = WebPEncodingSetError(pWVar15,WVar14);
    if (iVar8 != 0) goto LAB_00169c94;
  }
  else {
    if (enc->has_alpha != 0) {
      pWVar4 = enc->pic;
      local_68[0] = 0x56;
      local_68[1] = 0x50;
      local_68[2] = 0x38;
      local_68[3] = 0x58;
      local_68[4] = 10;
      local_68[5] = 0;
      local_68[6] = 0;
      local_68[7] = 0;
      uStack_60 = 0x10;
      uStack_5e = 0;
      iVar8 = pWVar4->width + -1;
      uStack_5c = (undefined1)iVar8;
      uStack_5b = (undefined1)((uint)iVar8 >> 8);
      uStack_5a = (undefined1)((uint)iVar8 >> 0x10);
      iVar8 = pWVar4->height + -1;
      uStack_59 = (undefined1)iVar8;
      local_58 = (undefined1)((uint)iVar8 >> 8);
      local_57 = (undefined1)((uint)iVar8 >> 0x10);
      iVar8 = (*pWVar4->writer)(local_68,0x12,pWVar4);
      if (iVar8 != 0) {
        if (enc->has_alpha != 0) {
          local_38 = enc->pic;
          local_68[0] = 0x41;
          local_68[1] = 0x4c;
          local_68[2] = 0x50;
          local_68[3] = 0x48;
          uVar12 = enc->alpha_data_size;
          local_68[4] = (byte)uVar12;
          local_68[5] = (byte)(uVar12 >> 8);
          local_68[6] = (byte)(uVar12 >> 0x10);
          local_68[7] = (byte)(uVar12 >> 0x18);
          iVar8 = (*local_38->writer)(local_68,8,local_38);
          if ((iVar8 == 0) ||
             (iVar8 = (*local_38->writer)(enc->alpha_data,(ulong)enc->alpha_data_size,local_38),
             iVar8 == 0)) goto LAB_00169c83;
          if ((enc->alpha_data_size & 1) != 0) {
            local_71 = '\0';
            iVar8 = (*local_38->writer)(&local_71,1,local_38);
            if (iVar8 == 0) goto LAB_00169c83;
          }
        }
        goto LAB_00169beb;
      }
LAB_00169c83:
      WVar14 = VP8_ENC_ERROR_BAD_WRITE;
      goto LAB_00169c88;
    }
LAB_00169beb:
    lVar11 = lVar11 + uVar13;
    local_68[0] = 0x56;
    local_68[1] = 0x50;
    local_68[2] = 0x38;
    local_68[3] = 0x20;
    local_68[4] = (byte)lVar11;
    local_68[5] = (byte)((ulong)lVar11 >> 8);
    local_68[6] = (byte)((ulong)lVar11 >> 0x10);
    local_68[7] = (byte)((ulong)lVar11 >> 0x18);
    iVar8 = (*pWVar15->writer)(local_68,8,pWVar15);
    WVar14 = VP8_ENC_ERROR_BAD_WRITE;
    if ((iVar8 == 0) || (WVar14 = VP8_ENC_ERROR_PARTITION0_OVERFLOW, 0x7ffff < local_70))
    goto LAB_00169c88;
    uVar9 = (int)local_70 << 5 | enc->profile * 2;
    local_68[0] = (byte)uVar9 | 0x10;
    local_68[1] = (byte)(uVar9 >> 8);
    local_68[2] = (byte)(uVar9 >> 0x10);
    local_68[3] = 0x9d;
    local_68[4] = 1;
    local_68[5] = 0x2a;
    uVar1 = (undefined2)pWVar15->width;
    local_68[6] = (byte)uVar1;
    local_68[7] = (byte)((ushort)uVar1 >> 8);
    uStack_60 = (undefined2)pWVar15->height;
    iVar8 = (*pWVar15->writer)(local_68,10,pWVar15);
    if (iVar8 == 0) goto LAB_00169c83;
LAB_00169c94:
    iVar8 = (*pic_00->writer)(local_48,local_70,pic_00);
    if (iVar8 != 0) {
      iVar8 = 1;
      if (1 < enc->num_parts) {
        uVar9 = enc->num_parts - 1;
        psVar10 = &enc->parts[0].pos;
        lVar11 = 0;
        do {
          uVar5 = *psVar10;
          if (0xffffff < uVar5) {
            WVar14 = VP8_ENC_ERROR_PARTITION_OVERFLOW;
            goto LAB_00169d20;
          }
          local_68[lVar11] = (byte)uVar5;
          local_68[lVar11 + 1] = (byte)(uVar5 >> 8);
          local_68[lVar11 + 2] = (byte)(uVar5 >> 0x10);
          lVar11 = lVar11 + 3;
          psVar10 = psVar10 + 6;
        } while ((ulong)uVar9 * 3 != lVar11);
        iVar7 = (*pic_00->writer)(local_68,(ulong)(uVar9 * 3),pic_00);
        if (iVar7 == 0) {
          WVar14 = VP8_ENC_ERROR_BAD_WRITE;
LAB_00169d20:
          iVar8 = WebPEncodingSetError(pic_00,WVar14);
        }
      }
      bVar19 = iVar8 != 0;
      goto LAB_00169d30;
    }
  }
  bVar19 = false;
LAB_00169d30:
  percent_store = &enc->percent;
  local_70 = uVar13;
  VP8BitWriterWipeOut(pVVar16);
  if (0 < enc->num_parts) {
    pVVar16 = enc->parts;
    lVar11 = 0;
    do {
      if (pVVar16->pos == 0) {
LAB_00169d73:
        VP8BitWriterWipeOut(pVVar16);
        if (!bVar19) goto LAB_00169da5;
        iVar8 = WebPReportProgress(pic_00,*percent_store + local_3c,percent_store);
        bVar19 = iVar8 != 0;
      }
      else {
        if (bVar19) {
          iVar8 = (*pic_00->writer)(pVVar16->buf,pVVar16->pos,pic_00);
          bVar19 = iVar8 != 0;
          goto LAB_00169d73;
        }
        VP8BitWriterWipeOut(pVVar16);
LAB_00169da5:
        bVar19 = false;
      }
      lVar11 = lVar11 + 1;
      pVVar16 = pVVar16 + 1;
    } while (lVar11 < enc->num_parts);
  }
  if ((bVar19) && (local_70 != 0)) {
    local_68[0] = 0;
    iVar8 = (*pic_00->writer)(local_68,1,pic_00);
    bVar19 = iVar8 != 0;
  }
  enc->coded_size = (int)uVar18 + 8;
  if ((bVar19) && (iVar8 = WebPReportProgress(pic_00,local_40 + 0x13,percent_store), iVar8 != 0)) {
    return 1;
  }
  WebPEncodingSetError(pic_00,VP8_ENC_ERROR_BAD_WRITE);
  return 0;
}

Assistant:

int VP8EncWrite(VP8Encoder* const enc) {
  WebPPicture* const pic = enc->pic;
  VP8BitWriter* const bw = &enc->bw;
  const int task_percent = 19;
  const int percent_per_part = task_percent / enc->num_parts;
  const int final_percent = enc->percent + task_percent;
  int ok = 0;
  size_t vp8_size, pad, riff_size;
  int p;

  // Partition #0 with header and partition sizes
  ok = GeneratePartition0(enc);
  if (!ok) return 0;

  // Compute VP8 size
  vp8_size = VP8_FRAME_HEADER_SIZE +
             VP8BitWriterSize(bw) +
             3 * (enc->num_parts - 1);
  for (p = 0; p < enc->num_parts; ++p) {
    vp8_size += VP8BitWriterSize(enc->parts + p);
  }
  pad = vp8_size & 1;
  vp8_size += pad;

  // Compute RIFF size
  // At the minimum it is: "WEBPVP8 nnnn" + VP8 data size.
  riff_size = TAG_SIZE + CHUNK_HEADER_SIZE + vp8_size;
  if (IsVP8XNeeded(enc)) {  // Add size for: VP8X header + data.
    riff_size += CHUNK_HEADER_SIZE + VP8X_CHUNK_SIZE;
  }
  if (enc->has_alpha) {  // Add size for: ALPH header + data.
    const uint32_t padded_alpha_size = enc->alpha_data_size +
                                       (enc->alpha_data_size & 1);
    riff_size += CHUNK_HEADER_SIZE + padded_alpha_size;
  }
  // RIFF size should fit in 32-bits.
  if (riff_size > 0xfffffffeU) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_FILE_TOO_BIG);
  }

  // Emit headers and partition #0
  {
    const uint8_t* const part0 = VP8BitWriterBuf(bw);
    const size_t size0 = VP8BitWriterSize(bw);
    ok = ok && PutWebPHeaders(enc, size0, vp8_size, riff_size)
            && pic->writer(part0, size0, pic)
            && EmitPartitionsSize(enc, pic);
    VP8BitWriterWipeOut(bw);    // will free the internal buffer.
  }

  // Token partitions
  for (p = 0; p < enc->num_parts; ++p) {
    const uint8_t* const buf = VP8BitWriterBuf(enc->parts + p);
    const size_t size = VP8BitWriterSize(enc->parts + p);
    if (size) ok = ok && pic->writer(buf, size, pic);
    VP8BitWriterWipeOut(enc->parts + p);    // will free the internal buffer.
    ok = ok && WebPReportProgress(pic, enc->percent + percent_per_part,
                                  &enc->percent);
  }

  // Padding byte
  if (ok && pad) {
    ok = PutPaddingByte(pic);
  }

  enc->coded_size = (int)(CHUNK_HEADER_SIZE + riff_size);
  ok = ok && WebPReportProgress(pic, final_percent, &enc->percent);
  if (!ok) WebPEncodingSetError(pic, VP8_ENC_ERROR_BAD_WRITE);
  return ok;
}